

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreTextureTarget
               (ContextType *contextType,GLenum target)

{
  ContextType CVar1;
  bool bVar2;
  ApiType AVar3;
  GLenum target_local;
  ContextType *contextType_local;
  
  CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
  AVar3 = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(CVar1,AVar3);
  if (bVar2) {
    contextType_local._7_1_ = es32::isCoreTextureTarget(target);
  }
  else {
    CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
    AVar3 = glu::ApiType::es(3,1);
    bVar2 = glu::contextSupports(CVar1,AVar3);
    if (bVar2) {
      contextType_local._7_1_ = es31::isCoreTextureTarget(target);
    }
    else {
      CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
      AVar3 = glu::ApiType::es(3,0);
      bVar2 = glu::contextSupports(CVar1,AVar3);
      if (bVar2) {
        contextType_local._7_1_ = es30::isCoreTextureTarget(target);
      }
      else {
        contextType_local._7_1_ = false;
      }
    }
  }
  return contextType_local._7_1_;
}

Assistant:

static bool isCoreTextureTarget (const glu::ContextType& contextType, glw::GLenum target)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreTextureTarget(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreTextureTarget(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreTextureTarget(target);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}